

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O2

void __thiscall ExpressionTemplateTest::arithmeticOperatorsTest(ExpressionTemplateTest *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  value_type vVar6;
  value_type vVar7;
  value_type vVar8;
  value_type vVar9;
  value_type vVar10;
  value_type vVar11;
  value_type vVar12;
  value_type vVar13;
  value_type vVar14;
  value_type vVar15;
  value_type vVar16;
  value_type vVar17;
  reference piVar18;
  size_t y;
  unsigned_long args;
  size_t x;
  size_t value;
  size_t z;
  unsigned_long args_1;
  bool local_161;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
  local_160;
  BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
  local_148;
  value_type local_12c;
  View<int,_false,_std::allocator<unsigned_long>_> w;
  View<int,_false,_std::allocator<unsigned_long>_> *local_e8;
  undefined4 local_e0;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  size_t shape [3];
  unsigned_long local_80;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_78;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_60;
  BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  local_48;
  
  shape[0] = 2;
  shape[1] = 3;
  shape[2] = 2;
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,false,std::allocator<unsigned_long>> *)&v,shape,&local_80,this->dataInt_,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&w);
  andres::View<int,false,std::allocator<unsigned_long>>::View<unsigned_long*>
            ((View<int,false,std::allocator<unsigned_long>> *)&w,shape,&local_80,this->dataInt_ + 2,
             &andres::defaultOrder,&andres::defaultOrder,(allocator_type *)&local_160);
  for (args_1 = 0; args_1 != 2; args_1 = args_1 + 1) {
    for (args = 0; args != 3; args = args + 1) {
      for (value = 0; value != 2; value = value + 1) {
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        iVar5 = *piVar18;
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        local_160.e1_ = (expression_type_1 *)CONCAT71(local_160.e1_._1_7_,iVar5 == *piVar18);
        test((bool *)&local_160);
        local_160.e1_ = &v;
        iVar5 = andres::
                UnaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                ::operator()((UnaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
                              *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        local_148.e1_._0_1_ = iVar5 + *piVar18 == 0;
        test((bool *)&local_148);
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = &v;
        vVar6 = andres::
                BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                              *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        local_148.e1_._0_1_ = vVar6 == *piVar18 + 2;
        test((bool *)&local_148);
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = &v;
        vVar7 = andres::
                BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()((BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                              *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        local_148.e1_._0_1_ = vVar7 == *piVar18 + 2;
        test((bool *)&local_148);
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_160,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   &v,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)&w);
        vVar8 = andres::
                BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                ::operator()(&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        iVar5 = *piVar18;
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&w,value,args,args_1);
        local_148.e1_._0_1_ = vVar8 == iVar5 + *piVar18;
        test((bool *)&local_148);
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = &v;
        vVar9 = andres::
                BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                              *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        local_148.e1_._0_1_ = vVar9 == 2 - *piVar18;
        test((bool *)&local_148);
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = &v;
        vVar10 = andres::
                 BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                               *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        local_148.e1_._0_1_ = vVar10 == *piVar18 + -2;
        test((bool *)&local_148);
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                    *)&local_160,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   &v,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)&w);
        vVar11 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                 ::operator()((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
                               *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        iVar5 = *piVar18;
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&w,value,args,args_1);
        local_148.e1_._0_1_ = vVar11 == iVar5 - *piVar18;
        test((bool *)&local_148);
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = &v;
        vVar12 = andres::
                 BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                               *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        local_148.e1_._0_1_ = vVar12 == *piVar18 * 2;
        test((bool *)&local_148);
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = &v;
        vVar13 = andres::
                 BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
                               *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        local_148.e1_._0_1_ = vVar13 == *piVar18 * 2;
        test((bool *)&local_148);
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                    *)&local_160,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   &v,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)&w);
        vVar14 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                 ::operator()((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
                               *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        iVar5 = *piVar18;
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&w,value,args,args_1);
        local_148.e1_._0_1_ = vVar14 == iVar5 * *piVar18;
        test((bool *)&local_148);
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = &v;
        vVar15 = andres::
                 BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                               *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        local_148.e1_._0_1_ = vVar15 == (int)(2 / (long)*piVar18);
        test((bool *)&local_148);
        local_160.e2_._0_4_ = 2;
        local_160.e1_ = &v;
        vVar16 = andres::
                 BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                 ::operator()((BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                               *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        local_148.e1_._0_1_ = vVar16 == *piVar18 / 2;
        test((bool *)&local_148);
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                    *)&local_160,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   &v,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)&w);
        vVar17 = andres::
                 BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                 ::operator()((BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::DividedBy<int,_int,_int>_>
                               *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        iVar5 = *piVar18;
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&w,value,args,args_1);
        local_148.e1_._0_1_ = vVar17 == iVar5 / *piVar18;
        test((bool *)&local_148);
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_60,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   &v,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)&v);
        local_e0 = 2;
        local_e8 = &v;
        andres::
        BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_48,
                   (ViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                    *)&local_e8,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   &w);
        andres::
        BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_148,
                   (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                    *)&local_60,
                   (ViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                    *)&local_48);
        andres::
        BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        ::BinaryViewExpression
                  (&local_78,
                   (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int> *)
                   &w,(ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)&w);
        andres::
        BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
        ::BinaryViewExpression
                  ((BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                    *)&local_160,
                   (ViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int>
                    *)&local_148,
                   (ViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int>
                    *)&local_78);
        local_12c = andres::
                    BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                    ::operator()((BinaryViewExpression<andres::BinaryViewExpression<andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Minus<int,_int,_int>_>,_int,_andres::BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>,_int,_andres::marray_detail::Plus<int,_int,_int>_>
                                  *)&local_160,value,args,args_1);
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        iVar5 = *piVar18;
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        iVar1 = *piVar18;
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&v,value,args,args_1);
        iVar2 = *piVar18;
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&w,value,args,args_1);
        iVar3 = *piVar18;
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&w,value,args,args_1);
        iVar4 = *piVar18;
        piVar18 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)&w,value,args,args_1);
        local_161 = local_12c == iVar4 * *piVar18 + iVar5 * iVar1 + iVar2 * iVar3 * -2;
        test(&local_161);
      }
    }
  }
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&w.geometry_);
  andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&v.geometry_);
  return;
}

Assistant:

void ExpressionTemplateTest::arithmeticOperatorsTest()
{
    std::size_t shape[] = {2, 3, 2};
    andres::View<int> v(shape, shape+3, dataInt_);
    andres::View<int> w(shape, shape+3, dataInt_ + 2);
    for(std::size_t z=0; z<2; ++z) {
        for(std::size_t y=0; y<3; ++y) {
            for(std::size_t x=0; x<2; ++x) {
                test((+v)(x,y,z) == + v(x,y,z));

                test((-v)(x,y,z) == - v(x,y,z));

                test((2+v)(x,y,z) == 2 + v(x,y,z));
                test((v+2)(x,y,z) == v(x,y,z) + 2);
                test((v+w)(x,y,z) == v(x,y,z) + w(x,y,z));

                test((2-v)(x,y,z) == 2 - v(x,y,z));
                test((v-2)(x,y,z) == v(x,y,z) - 2);
                test((v-w)(x,y,z) == v(x,y,z) - w(x,y,z));

                test((2*v)(x,y,z) == 2 * v(x,y,z));
                test((v*2)(x,y,z) == v(x,y,z) * 2);
                test((v*w)(x,y,z) == v(x,y,z) * w(x,y,z));

                test((2/v)(x,y,z) == 2 / v(x,y,z));
                test((v/2)(x,y,z) == v(x,y,z) / 2);
                test((v/w)(x,y,z) == v(x,y,z) / w(x,y,z));

                test((v*v - 2*v*w + w*w)(x,y,z)
                    == v(x,y,z)*v(x,y,z) - 2*v(x,y,z)*w(x,y,z)
                       + w(x,y,z)*w(x,y,z));
            }
        }
    }
}